

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlElementContentPtr xmlParseElementMixedContentDecl(xmlParserCtxtPtr ctxt,int inputchk)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  xmlChar *pxVar3;
  xmlElementContentPtr pxVar4;
  xmlElementContentPtr pxVar5;
  xmlChar *pxVar6;
  xmlParserErrors code;
  xmlElementContentPtr cur;
  
  pxVar2 = ctxt->input;
  if (((pxVar2->flags & 0x40) == 0) && ((long)pxVar2->end - (long)pxVar2->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  pxVar2 = ctxt->input;
  pxVar6 = pxVar2->cur;
  if (((((*pxVar6 == '#') && (pxVar6[1] == 'P')) && (pxVar6[2] == 'C')) &&
      ((pxVar6[3] == 'D' && (pxVar6[4] == 'A')))) && ((pxVar6[5] == 'T' && (pxVar6[6] == 'A')))) {
    pxVar2->cur = pxVar6 + 7;
    pxVar2->col = pxVar2->col + 7;
    if (pxVar6[7] == '\0') {
      xmlParserGrow(ctxt);
    }
    xmlSkipBlankCharsPE(ctxt);
    xVar1 = *ctxt->input->cur;
    if ((xVar1 == '(') || (xVar1 == '|')) {
      cur = (xmlElementContentPtr)0x0;
      pxVar4 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_PCDATA);
      if (pxVar4 != (xmlElementContentPtr)0x0) goto LAB_001369f3;
    }
    else if (xVar1 == ')') {
      if (ctxt->input->id != inputchk) {
        xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_BOUNDARY,XML_ERR_FATAL,
                   (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                   "Element content declaration doesn\'t start and stop in the same entity\n");
      }
      xmlNextChar(ctxt);
      cur = (xmlElementContentPtr)0x0;
      pxVar4 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_PCDATA);
      if (pxVar4 != (xmlElementContentPtr)0x0) {
        if (*ctxt->input->cur != '*') {
          return pxVar4;
        }
        pxVar4->ocur = XML_ELEMENT_CONTENT_MULT;
        xmlNextChar(ctxt);
        return pxVar4;
      }
    }
    else {
      pxVar4 = (xmlElementContentPtr)0x0;
LAB_001369f3:
      cur = pxVar4;
      pxVar6 = (xmlChar *)0x0;
      pxVar4 = cur;
      while( true ) {
        pxVar3 = ctxt->input->cur;
        xVar1 = *pxVar3;
        if (xVar1 != '|') break;
        if (1 < ctxt->disableSAX) goto LAB_00136ba0;
        xmlNextChar(ctxt);
        pxVar5 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_OR);
        if (pxVar5 == (xmlElementContentPtr)0x0) goto LAB_001369d7;
        if (pxVar6 == (xmlChar *)0x0) {
          pxVar5->c1 = pxVar4;
          cur = pxVar5;
          if (pxVar4 != (xmlElementContentPtr)0x0) goto LAB_00136a75;
        }
        else {
          pxVar4->c2 = pxVar5;
          pxVar5->parent = pxVar4;
          pxVar4 = xmlNewDocElementContent(ctxt->myDoc,pxVar6,XML_ELEMENT_CONTENT_ELEMENT);
          pxVar5->c1 = pxVar4;
          if (pxVar4 == (xmlElementContentPtr)0x0) goto LAB_001369d7;
LAB_00136a75:
          pxVar4->parent = pxVar5;
        }
        xmlSkipBlankCharsPE(ctxt);
        pxVar6 = xmlParseName(ctxt);
        if (pxVar6 == (xmlChar *)0x0) {
          xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_NAME_REQUIRED,XML_ERR_FATAL,
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                     "xmlParseElementMixedContentDecl : Name expected\n");
          xmlFreeDocElementContent(ctxt->myDoc,cur);
          return (xmlElementContentPtr)0x0;
        }
        xmlSkipBlankCharsPE(ctxt);
        pxVar2 = ctxt->input;
        pxVar4 = pxVar5;
        if (((pxVar2->flags & 0x40) == 0) && ((long)pxVar2->end - (long)pxVar2->cur < 0xfa)) {
          xmlParserGrow(ctxt);
        }
      }
      if ((xVar1 != ')') || (pxVar3[1] != '*')) {
LAB_00136ba0:
        xmlFreeDocElementContent(ctxt->myDoc,cur);
        code = XML_ERR_MIXED_NOT_STARTED;
        goto LAB_001369a3;
      }
      if (pxVar6 == (xmlChar *)0x0) {
LAB_00136b1a:
        if (cur != (xmlElementContentPtr)0x0) {
          cur->ocur = XML_ELEMENT_CONTENT_MULT;
        }
        if (ctxt->input->id != inputchk) {
          xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_BOUNDARY,XML_ERR_FATAL,
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                     "Element content declaration doesn\'t start and stop in the same entity\n");
        }
        pxVar2 = ctxt->input;
        pxVar6 = pxVar2->cur;
        pxVar2->cur = pxVar6 + 2;
        pxVar2->col = pxVar2->col + 2;
        if (pxVar6[2] != '\0') {
          return cur;
        }
        xmlParserGrow(ctxt);
        return cur;
      }
      pxVar5 = xmlNewDocElementContent(ctxt->myDoc,pxVar6,XML_ELEMENT_CONTENT_ELEMENT);
      pxVar4->c2 = pxVar5;
      if (pxVar5 != (xmlElementContentPtr)0x0) {
        pxVar5->parent = pxVar4;
        goto LAB_00136b1a;
      }
    }
LAB_001369d7:
    xmlCtxtErrMemory(ctxt);
    xmlFreeDocElementContent(ctxt->myDoc,cur);
  }
  else {
    code = XML_ERR_PCDATA_REQUIRED;
LAB_001369a3:
    xmlFatalErr(ctxt,code,(char *)0x0);
  }
  return (xmlElementContentPtr)0x0;
}

Assistant:

xmlElementContentPtr
xmlParseElementMixedContentDecl(xmlParserCtxtPtr ctxt, int inputchk) {
    xmlElementContentPtr ret = NULL, cur = NULL, n;
    const xmlChar *elem = NULL;

    GROW;
    if (CMP7(CUR_PTR, '#', 'P', 'C', 'D', 'A', 'T', 'A')) {
	SKIP(7);
	SKIP_BLANKS_PE;
	if (RAW == ')') {
	    if (ctxt->input->id != inputchk) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Element content declaration doesn't start and"
                               " stop in the same entity\n");
	    }
	    NEXT;
	    ret = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_PCDATA);
	    if (ret == NULL)
                goto mem_error;
	    if (RAW == '*') {
		ret->ocur = XML_ELEMENT_CONTENT_MULT;
		NEXT;
	    }
	    return(ret);
	}
	if ((RAW == '(') || (RAW == '|')) {
	    ret = cur = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_PCDATA);
	    if (ret == NULL)
                goto mem_error;
	}
	while ((RAW == '|') && (PARSER_STOPPED(ctxt) == 0)) {
	    NEXT;
            n = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_OR);
            if (n == NULL)
                goto mem_error;
	    if (elem == NULL) {
		n->c1 = cur;
		if (cur != NULL)
		    cur->parent = n;
		ret = cur = n;
	    } else {
	        cur->c2 = n;
		n->parent = cur;
		n->c1 = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
                if (n->c1 == NULL)
                    goto mem_error;
		n->c1->parent = n;
		cur = n;
	    }
	    SKIP_BLANKS_PE;
	    elem = xmlParseName(ctxt);
	    if (elem == NULL) {
		xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			"xmlParseElementMixedContentDecl : Name expected\n");
		xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    SKIP_BLANKS_PE;
	    GROW;
	}
	if ((RAW == ')') && (NXT(1) == '*')) {
	    if (elem != NULL) {
		cur->c2 = xmlNewDocElementContent(ctxt->myDoc, elem,
		                               XML_ELEMENT_CONTENT_ELEMENT);
		if (cur->c2 == NULL)
                    goto mem_error;
		cur->c2->parent = cur;
            }
            if (ret != NULL)
                ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    if (ctxt->input->id != inputchk) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Element content declaration doesn't start and"
                               " stop in the same entity\n");
	    }
	    SKIP(2);
	} else {
	    xmlFreeDocElementContent(ctxt->myDoc, ret);
	    xmlFatalErr(ctxt, XML_ERR_MIXED_NOT_STARTED, NULL);
	    return(NULL);
	}

    } else {
	xmlFatalErr(ctxt, XML_ERR_PCDATA_REQUIRED, NULL);
    }
    return(ret);

mem_error:
    xmlErrMemory(ctxt);
    xmlFreeDocElementContent(ctxt->myDoc, ret);
    return(NULL);
}